

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

bool __thiscall
xatlas::internal::segment::Atlas::computeChartBasis(Atlas *this,Chart *chart,Basis *basis)

{
  uint uVar1;
  Mesh *this_00;
  float fVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint *puVar6;
  Vector3 *pVVar7;
  Vector3 *pVVar8;
  uint local_30;
  uint32_t j;
  uint32_t f;
  uint32_t i;
  uint32_t faceCount;
  Basis *basis_local;
  Chart *chart_local;
  Atlas *this_local;
  
  uVar4 = Array<unsigned_int>::size(&chart->faces);
  uVar5 = Array<unsigned_int>::size(&chart->faces);
  Array<xatlas::internal::Vector3>::resize(&this->m_tempPoints,uVar5 * 3);
  for (j = 0; j < uVar4; j = j + 1) {
    puVar6 = Array<unsigned_int>::operator[](&chart->faces,j);
    uVar1 = *puVar6;
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      this_00 = this->m_mesh;
      uVar5 = Mesh::vertexAt(this->m_mesh,uVar1 * 3 + local_30);
      pVVar7 = Mesh::position(this_00,uVar5);
      pVVar8 = Array<xatlas::internal::Vector3>::operator[](&this->m_tempPoints,j * 3 + local_30);
      fVar2 = pVVar7->y;
      pVVar8->x = pVVar7->x;
      pVVar8->y = fVar2;
      pVVar8->z = pVVar7->z;
    }
  }
  pVVar7 = Array<xatlas::internal::Vector3>::data(&this->m_tempPoints);
  uVar4 = Array<xatlas::internal::Vector3>::size(&this->m_tempPoints);
  bVar3 = Fit::computeBasis(pVVar7,uVar4,basis);
  return bVar3;
}

Assistant:

bool computeChartBasis(Chart *chart, Basis *basis)
	{
		const uint32_t faceCount = chart->faces.size();
		m_tempPoints.resize(chart->faces.size() * 3);
		for (uint32_t i = 0; i < faceCount; i++) {
			const uint32_t f = chart->faces[i];
			for (uint32_t j = 0; j < 3; j++)
				m_tempPoints[i * 3 + j] = m_mesh->position(m_mesh->vertexAt(f * 3 + j));
		}
		return Fit::computeBasis(m_tempPoints.data(), m_tempPoints.size(), basis);
	}